

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

int32_t u_strcmp_63(UChar *s1,UChar *s2)

{
  UChar UVar1;
  UChar UVar2;
  UChar c2;
  UChar *pUStack_18;
  UChar c1;
  UChar *s2_local;
  UChar *s1_local;
  
  pUStack_18 = s2;
  s2_local = s1;
  do {
    UVar1 = *s2_local;
    UVar2 = *pUStack_18;
    if (UVar1 != UVar2) break;
    pUStack_18 = pUStack_18 + 1;
    s2_local = s2_local + 1;
  } while (UVar1 != L'\0');
  return (uint)(ushort)UVar1 - (uint)(ushort)UVar2;
}

Assistant:

U_CAPI int32_t   U_EXPORT2
u_strcmp(const UChar *s1, 
    const UChar *s2) 
{
    UChar  c1, c2;

    for(;;) {
        c1=*s1++;
        c2=*s2++;
        if (c1 != c2 || c1 == 0) {
            break;
        }
    }
    return (int32_t)c1 - (int32_t)c2;
}